

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O1

uint8_t cueify_full_toc_get_session_type(cueify_full_toc *t,uint8_t session)

{
  if (((t != (cueify_full_toc *)0x0) && (*(byte *)t <= session)) &&
     (session <= *(byte *)((long)t + 1))) {
    return *(uint8_t *)((long)t + (ulong)session * 0x20 + (ulong)session + 0x38a);
  }
  return '\0';
}

Assistant:

uint8_t cueify_full_toc_get_session_type(cueify_full_toc *t, uint8_t session) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (session >= toc->first_session_number &&
	       session <= toc->last_session_number) {
	return toc->sessions[session].session_type;
    } else {
	return 0;
    }
}